

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_auth.c
# Opt level: O0

ssize_t tnt_auth_raw(tnt_stream *s,char *user,int ulen,char *pass,int plen,char *base64_salt)

{
  uint64_t sync;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ssize_t sVar4;
  bool bVar5;
  char *len_end;
  char len_prefix [9];
  int i;
  size_t package_len;
  char scramble [20];
  char local_168 [8];
  char salt [64];
  char body [64];
  int guest;
  char *body_start;
  char *data;
  undefined1 auStack_c8 [4];
  int v_sz;
  iovec v [6];
  undefined1 local_60 [8];
  tnt_iheader hdr;
  char *base64_salt_local;
  int plen_local;
  char *pass_local;
  char *pcStack_18;
  int ulen_local;
  char *user_local;
  tnt_stream *s_local;
  
  data._4_4_ = 5;
  bVar5 = true;
  hdr.end = base64_salt;
  if ((user != (char *)0x0) && (bVar5 = false, ulen == 5)) {
    iVar1 = strncmp(user,"guest",5);
    bVar5 = iVar1 == 0;
  }
  pass_local._4_4_ = ulen;
  pcStack_18 = user;
  if (bVar5) {
    pcStack_18 = "guest";
    pass_local._4_4_ = 5;
  }
  sync = s->reqid;
  s->reqid = sync + 1;
  encode_header((tnt_iheader *)local_60,7,sync);
  v[0].iov_len = (size_t)local_60;
  v[1].iov_base = (void *)(hdr._24_8_ - (long)local_60);
  pcVar3 = salt + 0x38;
  pcVar2 = mp_encode_map(pcVar3,2);
  pcVar2 = mp_encode_uint(pcVar2,0x23);
  pcVar2 = mp_encode_strl(pcVar2,pass_local._4_4_);
  v[2].iov_base = pcVar2 + -(long)pcVar3;
  v[2].iov_len = (size_t)pcStack_18;
  v[3].iov_base = (void *)(long)(int)pass_local._4_4_;
  v[1].iov_len = (size_t)pcVar3;
  pcVar3 = mp_encode_uint(pcVar2,0x21);
  if (bVar5) {
    body_start = mp_encode_array(pcVar3,0);
  }
  else {
    pcVar3 = mp_encode_array(pcVar3,2);
    pcVar3 = mp_encode_str(pcVar3,"chap-sha1",9);
    body_start = mp_encode_strl(pcVar3,0x14);
    base64_decode(hdr.end,0x2c,local_168,0x40);
    tnt_scramble_prepare(&package_len,local_168,pass,plen);
    v[4].iov_len = (size_t)&package_len;
    v[5].iov_base = (void *)0x14;
    data._4_4_ = 6;
  }
  v[3].iov_len = (size_t)pcVar2;
  v[4].iov_base = body_start + -(long)pcVar2;
  stack0xfffffffffffffe70 = 0;
  len_prefix[1] = '\x01';
  len_prefix[2] = '\0';
  len_prefix[3] = '\0';
  len_prefix[4] = '\0';
  for (; (int)len_prefix._1_4_ < data._4_4_; len_prefix._1_4_ = len_prefix._1_4_ + 1) {
    register0x00000000 = (long)v[(int)len_prefix._1_4_].iov_base + stack0xfffffffffffffe70;
  }
  pcVar3 = mp_encode_luint32((char *)((long)&len_end + 3),stack0xfffffffffffffe70);
  _auStack_c8 = (void *)((long)&len_end + 3);
  v[0].iov_base = pcVar3 + -((long)&len_end + 3);
  sVar4 = (*s->writev)(s,(iovec *)auStack_c8,data._4_4_);
  return sVar4;
}

Assistant:

ssize_t
tnt_auth_raw(struct tnt_stream *s, const char *user, int ulen,
	     const char *pass, int plen, const char *base64_salt)
{
	struct tnt_iheader hdr;
	struct iovec v[6]; int v_sz = 5;
	char *data = NULL, *body_start = NULL;
	int guest = !user || (ulen == 5 && !strncmp(user, "guest", 5));
	if (guest) {
		user = "guest";
		ulen = 5;
	}
	encode_header(&hdr, TNT_OP_AUTH, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[64]; data = body; body_start = data;

	data = mp_encode_map(data, 2);
	data = mp_encode_uint(data, TNT_USERNAME);
	data = mp_encode_strl(data, ulen);
	v[2].iov_base = body_start;
	v[2].iov_len  = data - body_start;
	v[3].iov_base = (void *)user;
	v[3].iov_len  = ulen;
	body_start = data;
	data = mp_encode_uint(data, TNT_TUPLE);
	char salt[64], scramble[TNT_SCRAMBLE_SIZE];
	if (!guest) {
		data = mp_encode_array(data, 2);
		data = mp_encode_str(data, "chap-sha1", strlen("chap-sha1"));
		data = mp_encode_strl(data, TNT_SCRAMBLE_SIZE);
		base64_decode(base64_salt, TNT_SALT_SIZE, salt, 64);
		tnt_scramble_prepare(scramble, salt, pass, plen);
		v[5].iov_base = scramble;
		v[5].iov_len  = TNT_SCRAMBLE_SIZE;
		v_sz++;
	} else {
		data = mp_encode_array(data, 0);
	}
	v[4].iov_base = body_start;
	v[4].iov_len  = data - body_start;

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i) {
		package_len += v[i].iov_len;
	}
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}